

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_viewport.cpp
# Opt level: O1

bool ON_GetViewportRotationAngles
               (ON_3dVector *X,ON_3dVector *Y,ON_3dVector *Z,double *angle1,double *angle2,
               double *angle3)

{
  double *pdVar1;
  bool bVar2;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dc_00;
  undefined4 extraout_XMM0_Dc_01;
  undefined4 extraout_XMM0_Dc_02;
  undefined4 extraout_XMM0_Dd;
  undefined4 extraout_XMM0_Dd_00;
  undefined4 extraout_XMM0_Dd_01;
  undefined4 extraout_XMM0_Dd_02;
  double dVar3;
  double dVar4;
  double cos_a3;
  double sin_a3;
  double cos_a2;
  double sin_a2;
  double cos_a1;
  double sin_a1;
  double local_88;
  double local_80;
  undefined1 local_78 [16];
  double local_68;
  double local_60;
  double local_58;
  double local_50;
  undefined1 local_48 [16];
  double *local_38;
  
  local_50 = 0.0;
  local_58 = 1.0;
  local_60 = 0.0;
  local_68 = 1.0;
  local_80 = 0.0;
  local_88 = 1.0;
  local_38 = angle1;
  dVar4 = ON_3dVector::operator*(X,X);
  local_78._8_4_ = extraout_XMM0_Dc;
  local_78._0_8_ = dVar4;
  local_78._12_4_ = extraout_XMM0_Dd;
  dVar4 = ON_3dVector::operator*(Y,Y);
  local_48._8_4_ = extraout_XMM0_Dc_00;
  local_48._0_8_ = dVar4;
  local_48._12_4_ = extraout_XMM0_Dd_00;
  dVar4 = ON_3dVector::operator*(Z,Z);
  bVar2 = false;
  if (ABS((double)local_78._0_8_ + -1.0) <= 1.192092895508e-07) {
    if ((1.192092895508e-07 < ABS((double)local_48._0_8_ + -1.0)) ||
       (1.192092895508e-07 < ABS(dVar4 + -1.0))) {
      bVar2 = false;
    }
    else {
      dVar4 = ON_3dVector::operator*(X,Y);
      local_78._8_4_ = extraout_XMM0_Dc_01;
      local_78._0_8_ = dVar4;
      local_78._12_4_ = extraout_XMM0_Dd_01;
      dVar4 = ON_3dVector::operator*(Y,Z);
      local_48._8_4_ = extraout_XMM0_Dc_02;
      local_48._0_8_ = dVar4;
      local_48._12_4_ = extraout_XMM0_Dd_02;
      dVar4 = ON_3dVector::operator*(Z,X);
      bVar2 = false;
      if ((ABS((double)local_78._0_8_) <= 1.192092895508e-07) &&
         ((ABS((double)local_48._0_8_) <= 1.192092895508e-07 &&
          (bVar2 = false, ABS(dVar4) <= 1.192092895508e-07)))) {
        dVar4 = ON_TripleProduct(X,Y,Z);
        bVar2 = 0.0 < dVar4;
      }
    }
  }
  if (bVar2 == false) goto LAB_0067246b;
  local_68 = Z->z;
  dVar4 = ABS(Z->x);
  local_78._0_8_ = ABS(Z->y);
  if (dVar4 <= (double)local_78._0_8_) {
    dVar3 = 0.0;
    if (dVar4 < (double)local_78._0_8_) {
      dVar3 = (dVar4 / (double)local_78._0_8_) * (dVar4 / (double)local_78._0_8_);
      goto LAB_00672385;
    }
  }
  else {
    dVar3 = ((double)local_78._0_8_ / dVar4) * ((double)local_78._0_8_ / dVar4);
    local_78._0_8_ = dVar4;
LAB_00672385:
    dVar3 = dVar3 + 1.0;
    if (dVar3 < 0.0) {
      dVar3 = sqrt(dVar3);
    }
    else {
      dVar3 = SQRT(dVar3);
    }
    dVar3 = (double)local_78._0_8_ * dVar3;
  }
  local_78._0_8_ = angle2;
  local_60 = dVar3;
  unitize2d(local_68,dVar3,&local_68,&local_60);
  if (local_60 <= 0.0) {
    if ((local_68 != 1.0) || (NAN(local_68))) {
      angle2 = (double *)local_78._0_8_;
      if ((local_68 == -1.0) && (!NAN(local_68))) {
        local_88 = -Y->y;
        local_80 = Y->x;
      }
      goto LAB_0067246b;
    }
    local_88 = Y->y;
    local_80 = -Y->x;
  }
  else {
    local_50 = X->z;
    local_58 = Y->z;
    unitize2d(local_58,local_50,&local_58,&local_50);
    local_88 = -Z->y;
    local_80 = Z->x;
    unitize2d(local_88,local_80,&local_88,&local_80);
  }
  angle2 = (double *)local_78._0_8_;
LAB_0067246b:
  pdVar1 = local_38;
  if ((((local_58 == -1.0) && (!NAN(local_58))) && (local_50 == 0.0)) && (!NAN(local_50))) {
    local_50 = 0.0;
    local_58 = 0.0;
    local_60 = -local_60;
    local_80 = -local_80;
    local_88 = -local_88;
  }
  if (local_38 != (double *)0x0) {
    dVar4 = atan2(local_50,local_58);
    *pdVar1 = dVar4;
  }
  if (angle2 != (double *)0x0) {
    dVar4 = atan2(local_60,local_68);
    *angle2 = dVar4;
  }
  if (angle3 != (double *)0x0) {
    dVar4 = atan2(local_80,local_88);
    *angle3 = dVar4;
  }
  return bVar2;
}

Assistant:

bool 
ON_GetViewportRotationAngles( 
    const ON_3dVector& X, // X,Y,Z must be a right handed orthonormal basis
    const ON_3dVector& Y, 
    const ON_3dVector& Z,
    double* angle1, // returns rotation about world Z
    double* angle2, // returns rotation about world X ( 0 <= a2 <= pi )
    double* angle3  // returns rotation about world Z
    )
{
  // double a1 = 0.0;  // rotation about world Z
  // double a2 = 0.0;  // rotation about world X ( 0 <= a2 <= pi )
  // double a3 = 0.0;  // rotation about world Z
  bool bValidFrame = false;
  double sin_a1 = 0.0;
  double cos_a1 = 1.0;
  double sin_a2 = 0.0;
  double cos_a2 = 1.0;
  double sin_a3 = 0.0;
  double cos_a3 = 1.0;

  // If si = sin(ai) and ci = cos(ai), then the relationship between the camera
  // frame and the angles is defined by the matrix equation C = R3*R2*R1, where:
  //
  //      c1 -s1  0        1   0   0         c3 -s3  0
  // R1 = s1  c1  0  R2 =  0  c2 -s2   R3 =  s3  c3  0
  //       0   0  1        0  s2  c2          0   0  1
  //
  //     CamX[0]  CamY[0] CamZ[0]
  // C = CamX[1]  CamY[1] CamZ[1]
  //     CamX[2]  CamY[2] CamZ[2]
  //
  //              .       .     s2*s3
  //
  // R3*R2*R1 =   .       .    -s2*c3
  //
  //            s1*s2   c1*s2    c2
  //

  {
    // don't attempt to work with slop
    const double eps = 8.0*ON_SQRT_EPSILON;
    double dx,dy,dz,d;
    dx = X*X;
    dy = Y*Y;
    dz = Z*Z;
    if ( fabs(dx-1.0) <= eps && fabs(dy-1.0) <= eps && fabs(dz-1.0) <= eps ) {
      dx = X*Y;
      dy = Y*Z;
      dz = Z*X;
      if ( fabs(dx) <= eps && fabs(dy) <= eps && fabs(dz) <= eps ) {
        d = ON_TripleProduct( X, Y, Z );
        bValidFrame = (d > 0.0);
      }
    }
  }

  if ( bValidFrame ) 
  {
    // Usually "Z" = opposite of unitized camera direction.
    //         "Y" = camera up made ortho to "Z" and unitized.
    //         "X" = YxZ.
    // So, when possible, I solve for angles in terms
    // of "Z" and "Y" since "X" will generally have the most noise.
    //         
    // Use C = R3*R2*R1 to get sin(a2), cos(a2).
    cos_a2 = Z.z;
    sin_a2 = len2d(Z.x,Z.y);
    unitize2d(cos_a2,sin_a2,&cos_a2,&sin_a2); // kill noise

    if ( sin_a2 > 0.0 ) {
      // use bottom row to get angle1.
      sin_a1 = X.z;
      cos_a1 = Y.z;
      unitize2d(cos_a1,sin_a1,&cos_a1,&sin_a1); // kill noise

      // use right column to get angle3
      cos_a3 = -Z.y;
      sin_a3 =  Z.x;
      unitize2d(cos_a3,sin_a3,&cos_a3,&sin_a3); // kill noise
    }
    else if ( cos_a2 == 1.0 ) {
      // R2 = identity and C determines (angle1+angle3)
      //      arbitrarily set angle1 = 0.
      cos_a3 =  Y.y; // = cos(angle3+angle1)
      sin_a3 = -Y.x; // = sin(angle3+angle1)
    }
    else if ( cos_a2 == -1.0 ) {
      // R2 = [1 0 0 / 0 -1 0/ 0 0 -1] and C determines (angle3-angle1)
      //      arbitrarily set angle1 = 0
      cos_a3 = -Y.y; // = cos(angle3-angle1)
      sin_a3 =  Y.x; // = sin(angle3-angle1)
    }
  }


  if ( cos_a1 == -1.0 && sin_a1 == 0.0 ) {
    // when a1 = pi, juggle angles to get a1 = 0 with
    // same effective rotation to keep legacy 3d apps
    // happy.
    // a1: pi -> 0
    // a2: a2 -> 2pi - a2
    // a1: a3 ->  pi + a3
    sin_a1 = 0.0;
    cos_a1 = 0.0;
    sin_a2 = -sin_a2;
    sin_a3 = -sin_a3;
    cos_a3 = -cos_a3;
  }
  
  if ( angle1 )
    *angle1 = atan2( sin_a1, cos_a1 );
  if ( angle2 )
    *angle2 = atan2( sin_a2, cos_a2 );
  if ( angle3 )
    *angle3 = atan2( sin_a3, cos_a3 );

  return bValidFrame;
}